

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

BoundOrderByNode *
duckdb::BoundOrderByNode::Deserialize
          (BoundOrderByNode *__return_storage_ptr__,Deserializer *deserializer)

{
  OrderType type;
  OrderByNullType null_order;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  Expression *local_30;
  
  type = Deserializer::ReadProperty<duckdb::OrderType>(deserializer,100,"type");
  null_order = Deserializer::ReadProperty<duckdb::OrderByNullType>(deserializer,0x65,"null_order");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)&stack0xffffffffffffffd0,(field_id_t)deserializer,(char *)0x66);
  local_38._M_head_impl = local_30;
  local_30 = (Expression *)0x0;
  BoundOrderByNode(__return_storage_ptr__,type,null_order,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_38);
  if (local_38._M_head_impl != (Expression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_38._M_head_impl = (Expression *)0x0;
  if (local_30 != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_30 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundOrderByNode BoundOrderByNode::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<OrderType>(100, "type");
	auto null_order = deserializer.ReadProperty<OrderByNullType>(101, "null_order");
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(102, "expression");
	BoundOrderByNode result(type, null_order, std::move(expression));
	return result;
}